

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsestream.h
# Opt level: O2

FileName * __thiscall
embree::ParseStream::getFileName(FileName *__return_storage_ptr__,ParseStream *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (&local_30,
             &this->
              super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  FileName::FileName(__return_storage_ptr__,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

FileName getFileName()  {
      return FileName(get());
    }